

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbiter.cpp
# Opt level: O3

int __thiscall arbiter::Arbiter::copy(Arbiter *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Driver *pDVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  int iVar4;
  int extraout_EAX;
  char *extraout_RAX;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  char *pcVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  bool in_CL;
  pointer pbVar8;
  bool bVar9;
  string subpath;
  string srcToResolve;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  Endpoint dstEndpoint;
  string commonPrefix;
  string local_2d8;
  string local_2b8;
  undefined1 *local_298;
  long local_290;
  undefined1 local_288 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  string local_260;
  undefined1 local_240 [24];
  char local_228 [16];
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  Endpoint local_f8;
  string local_d0;
  string local_b0;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (*(long *)(dst + 8) == 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Cannot copy from empty source","");
    ::std::runtime_error::runtime_error(prVar7,(string *)local_50);
    *(undefined ***)prVar7 = &PTR__runtime_error_001950e8;
    __cxa_throw(prVar7,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(long *)(src + 8) == 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70[0] = local_60;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Cannot copy to empty destination","");
    ::std::runtime_error::runtime_error(prVar7,(string *)local_70);
    *(undefined ***)prVar7 = &PTR__runtime_error_001950e8;
    __cxa_throw(prVar7,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_90 = local_80;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,*(long *)dst,*(long *)(dst + 8) + *(long *)dst);
  if ((local_88 == 0) || ((local_90[local_88 + -1] != '/' && (local_90[local_88 + -1] != '\\')))) {
    pDVar1 = (Driver *)(local_240 + 0x10);
    local_240._0_8_ = pDVar1;
    ::std::__cxx11::string::_M_construct<char*>((string *)local_240,local_90,local_90 + local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._8_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if ((Driver *)local_240._0_8_ != pDVar1) {
        operator_delete((void *)local_240._0_8_);
      }
    }
    else if ((Driver *)local_240._0_8_ != pDVar1) {
      operator_delete((void *)local_240._0_8_);
    }
  }
  local_298 = local_288;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,*(long *)dst,*(long *)(dst + 8) + *(long *)dst);
  ::std::__cxx11::string::append((char *)&local_298);
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_298[local_290 + -1] == '*') {
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,*(long *)dst,*(long *)(dst + 8) + *(long *)dst);
    stripPostfixing(&local_b0,&local_178);
    getEndpoint((Endpoint *)local_240,this,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    Endpoint::prefixedRoot_abi_cxx11_(&local_d0,(Endpoint *)local_240);
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,*(long *)src,*(long *)(src + 8) + *(long *)src);
    getEndpoint(&local_f8,this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    Endpoint::prefixedRoot_abi_cxx11_(&local_2b8,(Endpoint *)local_240);
    Endpoint::prefixedRoot_abi_cxx11_(&local_2d8,&local_f8);
    _Var3._M_p = local_2d8._M_dataplus._M_p;
    if (local_2b8._M_string_length == local_2d8._M_string_length) {
      if (local_2b8._M_string_length == 0) {
        bVar9 = true;
      }
      else {
        iVar4 = bcmp(local_2b8._M_dataplus._M_p,local_2d8._M_dataplus._M_p,
                     local_2b8._M_string_length);
        bVar9 = iVar4 == 0;
      }
    }
    else {
      bVar9 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != &local_2d8.field_2) {
      operator_delete(_Var3._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p);
    }
    if (bVar9) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_118[0] = local_108;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"Cannot copy directory to itself","");
      ::std::runtime_error::runtime_error(prVar7,(string *)local_118);
      *(undefined ***)prVar7 = &PTR__runtime_error_001950e8;
      __cxa_throw(prVar7,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,local_298,local_298 + local_290);
    resolve(&local_278,this,&local_1b8,in_CL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if (local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar4 = 0;
      pbVar8 = local_278.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        ::std::__cxx11::string::substr((ulong)&local_2b8,(ulong)pbVar8);
        if (in_CL != false) {
          iVar4 = iVar4 + 1;
          poVar6 = (ostream *)::std::ostream::operator<<((ostream *)&::std::cout,iVar4);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          poVar6 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
          poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," -> ",4);
          Endpoint::prefixedFullPath(&local_2d8,&local_f8,&local_2b8);
          poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
          ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          ::std::ostream::put((char)poVar6);
          ::std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p);
          }
        }
        bVar9 = Endpoint::isLocal(&local_f8);
        if (bVar9) {
          Endpoint::fullPath(&local_1f8,&local_f8,&local_2b8);
          getDirname(&local_1d8,&local_1f8);
          mkdirp(&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p);
          }
        }
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_260,local_2b8._M_dataplus._M_p,
                   local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        pcVar2 = (pbVar8->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,pcVar2,pcVar2 + pbVar8->_M_string_length);
        getBinary((vector<char,_std::allocator<char>_> *)&local_2d8,this,&local_218);
        Endpoint::put(&local_f8,&local_260,(vector<char,_std::allocator<char>_> *)&local_2d8);
        if (local_2d8._M_dataplus._M_p != (char *)0x0) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p);
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.m_root._M_dataplus._M_p != &local_f8.m_root.field_2) {
      operator_delete(local_f8.m_root._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    pcVar5 = local_228;
    if ((char *)local_240._8_8_ == pcVar5) goto LAB_0013263d;
  }
  else {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,*(long *)dst,*(long *)(dst + 8) + *(long *)dst);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,*(long *)src,*(long *)(src + 8) + *(long *)src);
    copyFile(this,&local_138,&local_158,in_CL);
    pcVar5 = extraout_RAX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
      pcVar5 = extraout_RAX_00;
    }
    local_240._8_8_ = local_138._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_0013263d;
  }
  operator_delete((void *)local_240._8_8_);
  pcVar5 = extraout_RAX_01;
LAB_0013263d:
  iVar4 = (int)pcVar5;
  if (local_298 != local_288) {
    operator_delete(local_298);
    iVar4 = extraout_EAX;
  }
  return iVar4;
}

Assistant:

void Arbiter::copy(
        const std::string src,
        const std::string dst,
        const bool verbose) const
{
    if (src.empty()) throw ArbiterError("Cannot copy from empty source");
    if (dst.empty()) throw ArbiterError("Cannot copy to empty destination");

    // Globify the source path if it's a directory.  In this case, the source
    // already ends with a slash.
    const std::string srcToResolve(src + (isDirectory(src) ? "**" : ""));

    if (srcToResolve.back() != '*')
    {
        // The source is a single file.
        copyFile(src, dst, verbose);
    }
    else
    {
        // We'll need this to mirror the directory structure in the output.
        // All resolved paths will contain this common prefix, so we can
        // determine any nested paths from recursive resolutions by stripping
        // that common portion.
        const Endpoint& srcEndpoint(getEndpoint(stripPostfixing(src)));
        const std::string commonPrefix(srcEndpoint.prefixedRoot());

        const Endpoint dstEndpoint(getEndpoint(dst));

        if (srcEndpoint.prefixedRoot() == dstEndpoint.prefixedRoot())
        {
            throw ArbiterError("Cannot copy directory to itself");
        }

        int i(0);
        const auto paths(resolve(srcToResolve, verbose));

        for (const auto& path : paths)
        {
            const std::string subpath(path.substr(commonPrefix.size()));

            if (verbose)
            {
                std::cout <<
                    ++i << " / " << paths.size() << ": " <<
                    path << " -> " << dstEndpoint.prefixedFullPath(subpath) <<
                    std::endl;
            }

            if (dstEndpoint.isLocal())
            {
                mkdirp(getDirname(dstEndpoint.fullPath(subpath)));
            }

            dstEndpoint.put(subpath, getBinary(path));
        }
    }
}